

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalNinjaGenerator::WriteProcessedMakefile(cmLocalNinjaGenerator *this,ostream *os)

{
  cmMakefile *this_00;
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  char *__s;
  size_t sVar4;
  string local_50;
  
  cmGlobalNinjaGenerator::WriteDivider(os);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"# Write statements declared in CMakeLists.txt:",0x2e);
  cVar1 = (char)os;
  std::ios::widen((char)os->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"# ",2);
  this_00 = (this->super_cmLocalGenerator).Makefile;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_CURRENT_LIST_FILE","");
  __s = cmMakefile::GetDefinition(this_00,&local_50);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
  }
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  bVar2 = cmMakefile::IsRootMakefile((this->super_cmLocalGenerator).Makefile);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"# Which is the root file.",0x19);
    std::ios::widen((char)os->_vptr_basic_ostream[-3] + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  }
  cmGlobalNinjaGenerator::WriteDivider(os);
  std::ios::widen((char)os->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteProcessedMakefile(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os
    << "# Write statements declared in CMakeLists.txt:" << std::endl
    << "# "
    << this->Makefile->GetDefinition("CMAKE_CURRENT_LIST_FILE") << std::endl;
  if(this->Makefile->IsRootMakefile())
    os << "# Which is the root file." << std::endl;
  cmGlobalNinjaGenerator::WriteDivider(os);
  os << std::endl;
}